

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O2

void __thiscall
t_java_generator::generate_javax_generated_annotation(t_java_generator *this,ostream *out)

{
  tm *ptVar1;
  ostream *poVar2;
  char *pcVar3;
  time_t seconds;
  string local_50 [32];
  
  seconds = time((time_t *)0x0);
  ptVar1 = localtime(&seconds);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"@javax.annotation.Generated(value = \"");
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1d])(local_50,this);
  poVar2 = std::operator<<(poVar2,local_50);
  std::operator<<(poVar2,"\"");
  std::__cxx11::string::~string(local_50);
  if (this->undated_generated_annotations_ == true) {
    pcVar3 = ")";
  }
  else {
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,", date = \"");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,ptVar1->tm_year + 0x76c);
    poVar2 = std::operator<<(poVar2,"-");
    poVar2 = std::operator<<(poVar2,0x30);
    *(undefined8 *)(&poVar2->field_0x10 + (long)poVar2->_vptr_basic_ostream[-3]) = 2;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,ptVar1->tm_mon + 1);
    poVar2 = std::operator<<(poVar2,"-");
    poVar2 = std::operator<<(poVar2,0x30);
    *(undefined8 *)(&poVar2->field_0x10 + (long)poVar2->_vptr_basic_ostream[-3]) = 2;
    out = (ostream *)std::ostream::operator<<(poVar2,ptVar1->tm_mday);
    pcVar3 = "\")";
  }
  poVar2 = std::operator<<(out,pcVar3);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_java_generator::generate_javax_generated_annotation(ostream& out) {
  time_t seconds = time(nullptr);
  struct tm* now = localtime(&seconds);
  indent(out) << "@javax.annotation.Generated(value = \"" << autogen_summary() << "\"";
  if (undated_generated_annotations_) {
    out << ")" << endl;
  } else {
    indent(out) << ", date = \"" << (now->tm_year + 1900) << "-" << setfill('0') << setw(2)
                << (now->tm_mon + 1) << "-" << setfill('0') << setw(2) << now->tm_mday
                << "\")" << endl;
  }
}